

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::resolveConflict(Solver *this)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  SearchMode SVar5;
  uint32 uVar6;
  uint32 dl_00;
  ReportMode RVar7;
  SharedContext *ev;
  Solver *in_RDI;
  Solver *in_stack_00000020;
  uint32 dl;
  uint32 uipLevel;
  undefined8 in_stack_ffffffffffffff68;
  uint32 dl_01;
  Solver *in_stack_ffffffffffffff70;
  uint32 in_stack_ffffffffffffff78;
  uint32 in_stack_ffffffffffffff7c;
  DynamicLimit *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  Solver *in_stack_ffffffffffffffc8;
  bool local_1;
  
  dl_01 = (uint32)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  uVar2 = decisionLevel((Solver *)0x1eae21);
  uVar3 = rootLevel(in_RDI);
  if (uVar3 < uVar2) {
    uVar3 = decisionLevel((Solver *)0x1eae47);
    uVar4 = backtrackLevel(in_RDI);
    if ((uVar3 != uVar4) && (SVar5 = searchMode(in_RDI), SVar5 != no_learning)) {
      uVar6 = analyzeConflict(in_stack_00000020);
      dl_00 = decisionLevel((Solver *)0x1eae91);
      this_00 = (DynamicLimit *)&in_RDI->stats;
      uVar4 = dl_00;
      backtrackLevel(in_RDI);
      ConstraintScore::lbd((ConstraintScore *)in_stack_ffffffffffffff70);
      SolverStats::addConflict
                ((SolverStats *)this_00,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                 (uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 (uint32)in_stack_ffffffffffffff70);
      if (in_RDI->dynLimit_ != (DynamicLimit *)0x0) {
        in_stack_ffffffffffffff70 = (Solver *)in_RDI->dynLimit_;
        ConstraintScore::lbd((ConstraintScore *)in_stack_ffffffffffffff70);
        DynamicLimit::update(this_00,dl_00,in_stack_ffffffffffffff78);
        in_stack_ffffffffffffff7c = dl_00;
      }
      RVar7 = SharedContext::reportMode(in_RDI->shared_);
      if (RVar7 != report_default) {
        ev = sharedContext(in_RDI);
        NewConflictEvent::NewConflictEvent
                  ((NewConflictEvent *)this_00,
                   (Solver *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (LitVec *)in_stack_ffffffffffffff70,(ConstraintInfo *)ev);
        SharedContext::report((SharedContext *)in_stack_ffffffffffffff70,(Event *)ev);
        dl_01 = (uint32)((ulong)ev >> 0x20);
      }
      undoUntil(in_stack_ffffffffffffff70,dl_01);
      ClauseCreator::create
                ((Solver *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),(LitVec *)in_RDI,uVar3,
                 (ConstraintInfo *)CONCAT44(uVar6,uVar4));
      bVar1 = ClauseCreator::Result::operator_cast_to_bool((Result *)0x1eafe4);
      return bVar1;
    }
    local_1 = backtrack(in_stack_ffffffffffffffc8);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Solver::resolveConflict() {
	assert(hasConflict());
	if (decisionLevel() > rootLevel()) {
		if (decisionLevel() != backtrackLevel() && searchMode() != SolverStrategies::no_learning) {
			uint32 uipLevel = analyzeConflict();
			uint32 dl       = decisionLevel();
			stats.addConflict(dl, uipLevel, backtrackLevel(), ccInfo_.lbd());
			if (dynLimit_) { dynLimit_->update(dl, ccInfo_.lbd()); }
			if (shared_->reportMode()) {
				sharedContext()->report(NewConflictEvent(*this, cc_, ccInfo_));
			}
			undoUntil( uipLevel );
			return ClauseCreator::create(*this, cc_, ClauseCreator::clause_no_prepare, ccInfo_);
		}
		else {
			return backtrack();
		}
	}
	return false;
}